

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::BeginMenu(char *label,bool enabled)

{
  ImVec2 IVar1;
  int iVar2;
  ImGuiID IVar3;
  ImGuiWindow *this;
  ImGuiWindow *pIVar4;
  ImVec2 IVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  ImGuiID id;
  ImGuiID IVar11;
  value_type *pvVar12;
  byte bVar13;
  byte bVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  ImRect IVar19;
  ImVec2 ta;
  float local_78;
  float local_68;
  ImVec2 local_58;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar6 = GImGui;
  this = GImGui->CurrentWindow;
  this->Accessed = true;
  if (this->SkipItems != false) {
    return false;
  }
  bVar14 = 0;
  id = ImGuiWindow::GetID(this,label,(char *)0x0);
  IVar5 = CalcTextSize(label,(char *)0x0,true,-1.0);
  pIVar4 = pIVar6->FocusedWindow;
  bVar7 = IsPopupOpen(id);
  if ((this->Flags & 0x2000000) == 0) {
    iVar2 = (pIVar6->CurrentPopupStack).Size;
    if (iVar2 < (pIVar6->OpenPopupStack).Size) {
      pvVar12 = ImVector<ImGuiPopupRef>::operator[](&pIVar6->OpenPopupStack,iVar2);
      IVar3 = pvVar12->ParentMenuSet;
      bVar14 = 0;
      IVar11 = ImGuiWindow::GetID(this,"##menus",(char *)0x0);
      if (IVar3 == IVar11) {
        pIVar6->FocusedWindow = this;
        bVar14 = 1;
      }
    }
    else {
      bVar14 = 0;
    }
  }
  local_58 = (this->DC).CursorPos;
  fVar18 = local_58.x;
  fVar15 = local_58.y;
  local_68 = IVar5.x;
  if ((this->DC).LayoutType == 1) {
    local_58.y = fVar15;
    local_58.x = fVar18 - (this->WindowPadding).x;
    fVar18 = (pIVar6->Style).FramePadding.y;
    local_78 = ImGuiWindow::MenuBarHeight(this);
    local_78 = local_78 + (fVar15 - fVar18);
    (this->DC).CursorPos.x =
         (float)(int)((pIVar6->Style).ItemSpacing.x * 0.5) + (this->DC).CursorPos.x;
    IVar1 = (pIVar6->Style).ItemSpacing;
    fVar18 = IVar1.x;
    fVar15 = IVar1.y;
    ta.y = fVar15 + fVar15;
    ta.x = fVar18 + fVar18;
    PushStyleVar(7,&ta);
    ta = (ImVec2)((ulong)IVar5 & 0xffffffff);
    bVar8 = Selectable(label,bVar7,(uint)!enabled << 5 | 9,&ta);
    PopStyleVar(1);
    SameLine(0.0,-1.0);
    (this->DC).CursorPos.x =
         (float)(int)((pIVar6->Style).ItemSpacing.x * 0.5) + (this->DC).CursorPos.x;
    if (!enabled) goto LAB_001499c7;
LAB_00149950:
    bVar9 = IsHovered(&(this->DC).LastItemRect,id,false);
  }
  else {
    local_78 = fVar15 - (pIVar6->Style).WindowPadding.y;
    fVar17 = ImGuiSimpleColumns::DeclColumns
                       (&this->MenuColumns,local_68,0.0,(float)(int)(pIVar6->FontSize * 1.2));
    IVar5 = GetContentRegionAvail();
    fVar16 = IVar5.x - fVar17;
    fVar16 = (float)(~-(uint)(fVar16 <= 0.0) & (uint)fVar16);
    ta.y = 0.0;
    ta.x = fVar17;
    bVar8 = Selectable(label,bVar7,(uint)!enabled << 5 | 0x49,&ta);
    if (enabled) {
      IVar1.y = fVar15 + 0.0;
      IVar1.x = pIVar6->FontSize * 0.2 + fVar16 + (this->MenuColumns).Pos[2] + fVar18;
      RenderCollapseTriangle(IVar1,false,1.0,false);
      goto LAB_00149950;
    }
    PushStyleColor(0,(pIVar6->Style).Colors + 1);
    IVar5.y = fVar15 + 0.0;
    IVar5.x = pIVar6->FontSize * 0.2 + fVar16 + (this->MenuColumns).Pos[2] + fVar18;
    RenderCollapseTriangle(IVar5,false,1.0,false);
    PopStyleColor(1);
LAB_001499c7:
    bVar9 = false;
  }
  if (bVar14 != 0) {
    pIVar6->FocusedWindow = pIVar4;
  }
  if ((this->Flags & 0xa000000) == 0) {
    if ((bVar14 & bVar7 & bVar8) == 0) {
      if ((bVar8 == false) && ((bVar14 & bVar9) != 1 || bVar7)) {
        bVar14 = 0;
      }
      else {
        bVar14 = 1;
      }
      bVar13 = 0;
      goto LAB_00149a8f;
    }
    bVar14 = 0;
    bVar7 = false;
  }
  else {
    if ((pIVar6->HoveredWindow == this) &&
       (iVar2 = (pIVar6->CurrentPopupStack).Size, iVar2 < (pIVar6->OpenPopupStack).Size)) {
      pvVar12 = ImVector<ImGuiPopupRef>::operator[](&pIVar6->OpenPopupStack,iVar2);
      if (pvVar12->ParentWindow == this) {
        pvVar12 = ImVector<ImGuiPopupRef>::operator[]
                            (&pIVar6->OpenPopupStack,(pIVar6->CurrentPopupStack).Size);
        pIVar4 = pvVar12->Window;
        if (pIVar4 != (ImGuiWindow *)0x0) {
          IVar19 = ImGuiWindow::Rect(pIVar4);
          local_38.x = IVar19.Max.x;
          IVar5 = (pIVar6->IO).MousePos;
          IVar1 = (pIVar6->IO).MouseDelta;
          fVar15 = IVar5.x - IVar1.x;
          ta.y = IVar5.y - IVar1.y;
          fVar18 = (pIVar4->Pos).x;
          if (fVar18 < (this->Pos).x || fVar18 == (this->Pos).x) {
            fVar18 = 0.5;
          }
          else {
            fVar18 = -0.5;
            local_38.x = IVar19.Min.x;
          }
          fVar16 = ABS(fVar15 - local_38.x) * 0.3;
          fVar17 = 30.0;
          if (fVar16 <= 30.0) {
            fVar17 = fVar16;
          }
          fVar17 = (float)(-(uint)(fVar16 < 5.0) & 0x40a00000 |
                          ~-(uint)(fVar16 < 5.0) & (uint)fVar17);
          ta.x = fVar18 + fVar15;
          fVar18 = (IVar19.Min.y - fVar17) - ta.y;
          if (fVar18 <= -100.0) {
            fVar18 = -100.0;
          }
          local_38.y = fVar18 + ta.y;
          fVar18 = (IVar19.Max.y + fVar17) - ta.y;
          if (100.0 <= fVar18) {
            fVar18 = 100.0;
          }
          local_40.y = fVar18 + ta.y;
          local_40.x = local_38.x;
          bVar10 = ImIsPointInTriangle(&(pIVar6->IO).MousePos,&ta,&local_38,&local_40);
          goto LAB_00149a27;
        }
      }
      bVar10 = false;
    }
    else {
      bVar10 = false;
    }
LAB_00149a27:
    if ((bVar7 && bVar9 == false) && (pIVar6->HoveredWindow == this)) {
      bVar13 = (bVar10 ^ 1U) & pIVar6->HoveredIdPreviousFrame != 0 &
               pIVar6->HoveredIdPreviousFrame != id;
    }
    else {
      bVar13 = 0;
    }
    bVar14 = (bVar9 ^ 1U | bVar10 | bVar7) ^ 1;
    if (!bVar7) {
      bVar14 = bVar8 & bVar9 | bVar14;
    }
LAB_00149a8f:
    if ((enabled) && (bVar13 == 0)) goto LAB_00149ac0;
  }
  bVar8 = IsPopupOpen(id);
  if (bVar8) {
    ClosePopupToLevel((GImGui->CurrentPopupStack).Size);
  }
LAB_00149ac0:
  if (((bVar7 == false) && (bVar14 != 0)) &&
     ((pIVar6->CurrentPopupStack).Size < (pIVar6->OpenPopupStack).Size)) {
    OpenPopup(label);
    return false;
  }
  if (bVar14 == 0) {
    if (bVar7 == false) {
      return false;
    }
  }
  else {
    OpenPopup(label);
  }
  pIVar6 = GImGui;
  (GImGui->SetNextWindowPosVal).x = local_58.x;
  (pIVar6->SetNextWindowPosVal).y = local_78;
  pIVar6->SetNextWindowPosCond = 1;
  bVar7 = BeginPopupEx(label,(uint)((this->Flags & 0xa000000U) != 0) << 0x14 | 0x8000080);
  return bVar7;
}

Assistant:

bool ImGui::BeginMenu(const char* label, bool enabled)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    ImVec2 label_size = CalcTextSize(label, NULL, true);
    ImGuiWindow* backed_focused_window = g.FocusedWindow;

    bool pressed;
    bool menu_is_open = IsPopupOpen(id);
    bool menuset_is_open = !(window->Flags & ImGuiWindowFlags_Popup) && (g.OpenPopupStack.Size > g.CurrentPopupStack.Size && g.OpenPopupStack[g.CurrentPopupStack.Size].ParentMenuSet == window->GetID("##menus"));
    if (menuset_is_open)
        g.FocusedWindow = window;

    ImVec2 popup_pos, pos = window->DC.CursorPos;
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
    {
        popup_pos = ImVec2(pos.x - window->WindowPadding.x, pos.y - style.FramePadding.y + window->MenuBarHeight());
        window->DC.CursorPos.x += (float)(int)(style.ItemSpacing.x * 0.5f);
        PushStyleVar(ImGuiStyleVar_ItemSpacing, style.ItemSpacing * 2.0f);
        float w = label_size.x;
        pressed = Selectable(label, menu_is_open, ImGuiSelectableFlags_Menu | ImGuiSelectableFlags_DontClosePopups | (!enabled ? ImGuiSelectableFlags_Disabled : 0), ImVec2(w, 0.0f));
        PopStyleVar();
        SameLine();
        window->DC.CursorPos.x += (float)(int)(style.ItemSpacing.x * 0.5f);
    }
    else
    {
        popup_pos = ImVec2(pos.x, pos.y - style.WindowPadding.y);
        float w = window->MenuColumns.DeclColumns(label_size.x, 0.0f, (float)(int)(g.FontSize * 1.20f)); // Feedback to next frame
        float extra_w = ImMax(0.0f, GetContentRegionAvail().x - w);
        pressed = Selectable(label, menu_is_open, ImGuiSelectableFlags_Menu | ImGuiSelectableFlags_DontClosePopups | ImGuiSelectableFlags_DrawFillAvailWidth | (!enabled ? ImGuiSelectableFlags_Disabled : 0), ImVec2(w, 0.0f));
        if (!enabled) PushStyleColor(ImGuiCol_Text, g.Style.Colors[ImGuiCol_TextDisabled]);
        RenderCollapseTriangle(pos + ImVec2(window->MenuColumns.Pos[2] + extra_w + g.FontSize * 0.20f, 0.0f), false);
        if (!enabled) PopStyleColor();
    }

    bool hovered = enabled && IsHovered(window->DC.LastItemRect, id);
    if (menuset_is_open)
        g.FocusedWindow = backed_focused_window;

    bool want_open = false, want_close = false;
    if (window->Flags & (ImGuiWindowFlags_Popup|ImGuiWindowFlags_ChildMenu))
    {
        // Implement http://bjk5.com/post/44698559168/breaking-down-amazons-mega-dropdown to avoid using timers, so menus feels more reactive.
        bool moving_within_opened_triangle = false;
        if (g.HoveredWindow == window && g.OpenPopupStack.Size > g.CurrentPopupStack.Size && g.OpenPopupStack[g.CurrentPopupStack.Size].ParentWindow == window)
        {
            if (ImGuiWindow* next_window = g.OpenPopupStack[g.CurrentPopupStack.Size].Window)
            {
                ImRect next_window_rect = next_window->Rect();
                ImVec2 ta = g.IO.MousePos - g.IO.MouseDelta;
                ImVec2 tb = (window->Pos.x < next_window->Pos.x) ? next_window_rect.GetTL() : next_window_rect.GetTR();
                ImVec2 tc = (window->Pos.x < next_window->Pos.x) ? next_window_rect.GetBL() : next_window_rect.GetBR();
                float extra = ImClamp(fabsf(ta.x - tb.x) * 0.30f, 5.0f, 30.0f); // add a bit of extra slack.
                ta.x += (window->Pos.x < next_window->Pos.x) ? -0.5f : +0.5f;   // to avoid numerical issues
                tb.y = ta.y + ImMax((tb.y - extra) - ta.y, -100.0f);            // triangle is maximum 200 high to limit the slope and the bias toward large sub-menus // FIXME: Multiply by fb_scale?
                tc.y = ta.y + ImMin((tc.y + extra) - ta.y, +100.0f);
                moving_within_opened_triangle = ImIsPointInTriangle(g.IO.MousePos, ta, tb, tc);
                //window->DrawList->PushClipRectFullScreen(); window->DrawList->AddTriangleFilled(ta, tb, tc, moving_within_opened_triangle ? 0x80008000 : 0x80000080); window->DrawList->PopClipRect(); // Debug
            }
        }

        want_close = (menu_is_open && !hovered && g.HoveredWindow == window && g.HoveredIdPreviousFrame != 0 && g.HoveredIdPreviousFrame != id && !moving_within_opened_triangle);
        want_open = (!menu_is_open && hovered && !moving_within_opened_triangle) || (!menu_is_open && hovered && pressed);
    }
    else if (menu_is_open && pressed && menuset_is_open) // menu-bar: click open menu to close
    {
        want_close = true;
        want_open = menu_is_open = false;
    }
    else if (pressed || (hovered && menuset_is_open && !menu_is_open)) // menu-bar: first click to open, then hover to open others
        want_open = true;
    if (!enabled) // explicitly close if an open menu becomes disabled, facilitate users code a lot in pattern such as 'if (BeginMenu("options", has_object)) { ..use object.. }'
        want_close = true;
    if (want_close && IsPopupOpen(id))
        ClosePopupToLevel(GImGui->CurrentPopupStack.Size);

    if (!menu_is_open && want_open && g.OpenPopupStack.Size > g.CurrentPopupStack.Size)
    {
        // Don't recycle same menu level in the same frame, first close the other menu and yield for a frame.
        OpenPopup(label);
        return false;
    }

    menu_is_open |= want_open;
    if (want_open)
        OpenPopup(label);

    if (menu_is_open)
    {
        SetNextWindowPos(popup_pos, ImGuiSetCond_Always);
        ImGuiWindowFlags flags = ImGuiWindowFlags_ShowBorders | ((window->Flags & (ImGuiWindowFlags_Popup|ImGuiWindowFlags_ChildMenu)) ? ImGuiWindowFlags_ChildMenu|ImGuiWindowFlags_ChildWindow : ImGuiWindowFlags_ChildMenu);
        menu_is_open = BeginPopupEx(label, flags); // menu_is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
    }

    return menu_is_open;
}